

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O0

void Pf_StoCreateGateAdd(Pf_Man_t *pMan,word uTruth,int *pFans,int nFans,int CellId)

{
  Vec_Int_t *p;
  int iVar1;
  int iVar2;
  Pf_Mat_t PVar3;
  ulong local_60;
  ulong uStack_50;
  int iFunc;
  word uFunc;
  int local_40;
  int fCompl;
  int Entry;
  int GateId;
  int i;
  Pf_Mat_t Mat;
  Vec_Int_t *vArray;
  int CellId_local;
  int nFans_local;
  int *pFans_local;
  word uTruth_local;
  Pf_Man_t *pMan_local;
  
  GateId = (int)Pf_Int2Mat(0);
  uFunc._4_4_ = (uint)uTruth & 1;
  local_60 = uTruth;
  if ((uTruth & 1) != 0) {
    local_60 = uTruth ^ 0xffffffffffffffff;
  }
  uStack_50 = local_60;
  iVar1 = Vec_MemHashInsert(pMan->vTtMem,&stack0xffffffffffffffb0);
  iVar2 = Vec_WecSize(pMan->vTt2Match);
  if (iVar1 == iVar2) {
    Vec_WecPushLevel(pMan->vTt2Match);
  }
  _i = Vec_WecEntry(pMan->vTt2Match,iVar1);
  GateId = GateId & 0xffffff00U | uFunc._4_4_ & 0xff;
  if (6 < nFans) {
    __assert_fail("nFans < 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPf.c"
                  ,0x9e,"void Pf_StoCreateGateAdd(Pf_Man_t *, word, int *, int, int)");
  }
  for (Entry = 0; Entry < nFans; Entry = Entry + 1) {
    iVar1 = Abc_Lit2Var(pFans[Entry]);
    GateId = GateId & 0x3fffU |
             ((uint)GateId >> 0xe | iVar1 << ((char)Entry * '\x03' & 0x1fU)) << 0xe;
    iVar1 = Abc_LitIsCompl(pFans[Entry]);
    GateId = GateId & 0xffffc0ffU |
             ((uint)GateId >> 8 & 0x3f | iVar1 << ((byte)Entry & 0x1f) & 0x3fU) << 8;
  }
  for (Entry = 0; iVar1 = Entry + 1, iVar2 = Vec_IntSize(_i), iVar1 < iVar2; Entry = Entry + 2) {
    fCompl = Vec_IntEntry(_i,Entry);
    local_40 = Vec_IntEntry(_i,Entry + 1);
    if ((fCompl == CellId) &&
       (PVar3 = Pf_Int2Mat(local_40), ((uint)PVar3 >> 8 & 0x3f) == ((uint)GateId >> 8 & 0x3f)))
    break;
  }
  iVar1 = Entry;
  iVar2 = Vec_IntSize(_i);
  if (iVar1 == iVar2) {
    Vec_IntPush(_i,CellId);
    p = _i;
    iVar1 = Pf_Mat2Int((Pf_Mat_t)GateId);
    Vec_IntPush(p,iVar1);
  }
  return;
}

Assistant:

void Pf_StoCreateGateAdd( Pf_Man_t * pMan, word uTruth, int * pFans, int nFans, int CellId )
{
    Vec_Int_t * vArray;
    Pf_Mat_t Mat = Pf_Int2Mat(0);
    int i, GateId, Entry, fCompl = (int)(uTruth & 1);
    word uFunc = fCompl ? ~uTruth : uTruth;
    int iFunc = Vec_MemHashInsert( pMan->vTtMem, &uFunc );
    if ( iFunc == Vec_WecSize(pMan->vTt2Match) )
        Vec_WecPushLevel( pMan->vTt2Match );
    vArray = Vec_WecEntry( pMan->vTt2Match, iFunc );
    Mat.fCompl = fCompl;
    assert( nFans < 7 );
    for ( i = 0; i < nFans; i++ )
    {
        Mat.Perm  |= (unsigned)(Abc_Lit2Var(pFans[i]) << (3*i));
        Mat.Phase |= (unsigned)(Abc_LitIsCompl(pFans[i]) << i);
    }
    // check if the same one exists
    Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
        if ( GateId == CellId && Pf_Int2Mat(Entry).Phase == Mat.Phase )
            break;
    if ( i == Vec_IntSize(vArray) )
    {
        Vec_IntPush( vArray, CellId );
        Vec_IntPush( vArray, Pf_Mat2Int(Mat) );
    }
}